

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

type __thiscall
c4::yml::Tree::to_arena<c4::fmt::base64_wrapper_<char_const>>
          (Tree *this,base64_wrapper_<const_char> *a)

{
  substr buf;
  Location loc;
  bool bVar1;
  error_flags eVar2;
  size_t sVar3;
  Tree *this_00;
  undefined8 *in_RSI;
  char *in_RDI;
  substr sVar4;
  ro_substr rVar5;
  type tVar6;
  size_t num;
  substr rem;
  size_t in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  Location *in_stack_fffffffffffffee0;
  const_base64_wrapper b;
  char *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  size_t local_f8;
  Tree *in_stack_ffffffffffffff18;
  char (*in_stack_ffffffffffffff20) [29];
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 uVar7;
  undefined8 uVar8;
  char *local_a0;
  ulong local_98;
  ulong local_8;
  
  this_00 = (Tree *)(in_RDI + 0x28);
  if (*(ulong *)(in_RDI + 0x30) < *(ulong *)(in_RDI + 0x38)) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) &&
       (in_stack_fffffffffffffef7 = is_debugger_attached(), (bool)in_stack_fffffffffffffef7)) {
      trap_instruction();
    }
    handle_error(0x344e8b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
  sVar4.len = (size_t)this_00;
  sVar4.str = in_RDI;
  b = SUB81(in_stack_fffffffffffffee8,0);
  sVar3 = to_chars(sVar4,b);
  if (local_8 < sVar3) {
    sVar4 = _grow_arena(this_00,(size_t)in_RDI);
    local_a0 = sVar4.str;
    local_98 = sVar4.len;
    uVar7 = *in_RSI;
    uVar8 = in_RSI[1];
    buf.len = (size_t)this_00;
    buf.str = in_RDI;
    sVar3 = to_chars(buf,b);
    if (local_98 < sVar3) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      loc.super_LineCol.line = in_stack_ffffffffffffff38;
      loc.super_LineCol.offset = in_stack_ffffffffffffff30;
      loc.super_LineCol.col = uVar7;
      loc.name.str = (char *)uVar8;
      loc.name.len = (size_t)local_a0;
      error<29ul>(in_stack_ffffffffffffff20,loc);
    }
  }
  _request_span(in_stack_ffffffffffffff18,local_f8);
  rVar5 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x33d897);
  tVar6.str = rVar5.str;
  tVar6.len = rVar5.len;
  return tVar6;
}

Assistant:

typename std::enable_if<!std::is_floating_point<T>::value, csubstr>::type
    to_arena(T const& C4_RESTRICT a)
    {
        substr rem(m_arena.sub(m_arena_pos));
        size_t num = to_chars(rem, a);
        if(num > rem.len)
        {
            rem = _grow_arena(num);
            num = to_chars(rem, a);
            RYML_ASSERT(num <= rem.len);
        }
        rem = _request_span(num);
        return rem;
    }